

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenio::save_edges(tetgenio *this,char *filebasename)

{
  FILE *__stream;
  long lVar1;
  char outedgefilename [1024];
  char acStack_428 [1024];
  
  sprintf(acStack_428,"%s.edge",filebasename);
  printf("Saving edges to %s\n",acStack_428);
  __stream = fopen(acStack_428,"w");
  fprintf(__stream,"%d  %d\n",(ulong)(uint)this->numberofedges,
          (ulong)(this->edgemarkerlist != (int *)0x0));
  if (0 < this->numberofedges) {
    lVar1 = 0;
    do {
      fprintf(__stream,"%d  %4d  %4d",(ulong)(uint)(this->firstnumber + (int)lVar1),
              (ulong)(uint)this->edgelist[lVar1 * 2],(ulong)(uint)this->edgelist[lVar1 * 2 + 1]);
      if (this->edgemarkerlist != (int *)0x0) {
        fprintf(__stream,"  %d",(ulong)(uint)this->edgemarkerlist[lVar1]);
      }
      fputc(10,__stream);
      lVar1 = lVar1 + 1;
    } while (lVar1 < this->numberofedges);
  }
  fclose(__stream);
  return;
}

Assistant:

void tetgenio::save_edges(char* filebasename)
{
  FILE *fout;
  char outedgefilename[FILENAMESIZE];
  int i;

  sprintf(outedgefilename, "%s.edge", filebasename);
  printf("Saving edges to %s\n", outedgefilename);
  fout = fopen(outedgefilename, "w");
  fprintf(fout, "%d  %d\n", numberofedges, edgemarkerlist != NULL ? 1 : 0);
  for (i = 0; i < numberofedges; i++) {
    fprintf(fout, "%d  %4d  %4d", i + firstnumber, edgelist[i * 2],
            edgelist[i * 2 + 1]);
    if (edgemarkerlist != NULL) {
      fprintf(fout, "  %d", edgemarkerlist[i]);
    }
    fprintf(fout, "\n");
  }

  fclose(fout);
}